

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O0

void __thiscall Clasp::SatElite::addToSubQueue(SatElite *this,uint32 clauseId)

{
  bool bVar1;
  Clause *pCVar2;
  undefined4 in_ESI;
  uint *in_RDI;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  uint32 clId;
  undefined4 in_stack_fffffffffffffff0;
  uint *x;
  
  x = in_RDI;
  pCVar2 = SatPreprocessor::clause
                     ((SatPreprocessor *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                      (uint32)((ulong)in_RDI >> 0x20));
  clId = (uint32)((ulong)in_RDI >> 0x20);
  bVar1 = SatPreprocessor::Clause::inQ(pCVar2);
  if (!bVar1) {
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(unaff_retaddr,x);
    pCVar2 = SatPreprocessor::clause
                       ((SatPreprocessor *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),clId);
    SatPreprocessor::Clause::setInQ(pCVar2,true);
  }
  return;
}

Assistant:

void SatElite::addToSubQueue(uint32 clauseId) {
	assert(clause(clauseId) != 0);
	if (!clause(clauseId)->inQ()) {
		queue_.push_back(clauseId);
		clause(clauseId)->setInQ(true);
	}
}